

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O1

vector<std::reference_wrapper<duckdb::ExpressionBinder>,_true> * __thiscall
duckdb::Binder::GetActiveBinders(Binder *this)

{
  reference<Binder> root;
  shared_ptr<duckdb::Binder,_true> *this_00;
  
  if ((this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    this_00 = &this->parent;
    do {
      if (this->binder_type != REGULAR_BINDER) break;
      this = shared_ptr<duckdb::Binder,_true>::operator*(this_00);
      this_00 = &this->parent;
    } while ((this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != (element_type *)0x0);
  }
  return &this->active_binders;
}

Assistant:

vector<reference<ExpressionBinder>> &Binder::GetActiveBinders() {
	reference<Binder> root = *this;
	while (root.get().parent && root.get().binder_type == BinderType::REGULAR_BINDER) {
		root = *root.get().parent;
	}
	auto &root_binder = root.get();
	return root_binder.active_binders;
}